

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&> * __thiscall
testing::internal::PointeeMatcher::operator_cast_to_Matcher
          (Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *__return_storage_ptr__,
          PointeeMatcher *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = &PTR__Impl_00262e48;
  Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)(puVar1 + 1),(int *)this);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>).vtable_ =
       (VTable *)
       MatcherBase<std::unique_ptr<int,std::default_delete<int>>const&>::
       GetVTable<testing::internal::MatcherBase<std::unique_ptr<int,std::default_delete<int>>const&>::ValuePolicy<testing::MatcherInterface<std::unique_ptr<int,std::default_delete<int>>const&>const*,true>>()
       ::kVTable;
  puVar2 = (undefined4 *)operator_new(0x10);
  *puVar2 = 1;
  *(undefined8 **)(puVar2 + 2) = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>).buffer_.ptr = puVar2;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00262d98;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Pointer>() const {
    return Matcher<Pointer>(new Impl<const Pointer&>(matcher_));
  }